

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O1

string * std::format<bool,int,unsigned_long>
                   (string *__return_storage_ptr__,string_view fmt,bool *ts,int *ts_1,
                   unsigned_long *ts_2)

{
  char *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  stringstream ss;
  unsigned_long *local_3c0;
  long local_3b8;
  char *local_3b0;
  long local_3a8;
  char *local_3a0;
  long local_398;
  char *local_390;
  long alStack_388 [58];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar5 = fmt._M_str;
  sVar7 = fmt._M_len;
  uVar9 = 0;
  local_3c0 = ts_2;
  memset(&local_3b8,0,0x200);
  pcVar1 = pcVar5 + sVar7;
  pcVar4 = pcVar5;
  if (sVar7 != 0) {
    uVar9 = 0;
    pcVar3 = pcVar5;
    pcVar6 = pcVar5;
    pcVar8 = pcVar5;
    do {
      pcVar4 = pcVar8;
      if ((*pcVar8 != '}') && (pcVar4 = pcVar3, *pcVar8 == '{')) {
        if (pcVar3 == pcVar5) {
          (&local_3b8)[uVar9 * 2] = (long)pcVar6 - (long)pcVar3;
          (&local_3b0)[uVar9 * 2] = pcVar3;
          uVar9 = uVar9 + 1;
        }
        else if (uVar9 < 0x20 && pcVar8 != pcVar3) {
          (&local_3b8)[uVar9 * 2] = (long)(pcVar6 + ~(ulong)pcVar3);
          (&local_3b0)[uVar9 * 2] = pcVar3 + 1;
          uVar9 = uVar9 + 1;
        }
      }
      pcVar8 = pcVar8 + 1;
      pcVar6 = pcVar6 + 1;
      sVar7 = sVar7 - 1;
      pcVar3 = pcVar4;
    } while (sVar7 != 0);
  }
  pcVar4 = pcVar4 + 1;
  if (pcVar4 != pcVar1) {
    (&local_3b8)[uVar9 * 2] = (long)pcVar1 - (long)pcVar4;
    (&local_3b0)[uVar9 * 2] = pcVar4;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3b0,local_3b8);
  std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3a0,local_3a8);
  std::ostream::operator<<(poVar2,*ts_1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_390,local_398);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  for (lVar10 = 0x38; lVar10 != 0x208; lVar10 = lVar10 + 0x10) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)((long)&local_3b8 + lVar10),*(long *)((long)&local_3c0 + lVar10))
    ;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}